

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O2

string * __thiscall
libcellml::XmlNode::attribute_abi_cxx11_
          (string *__return_storage_ptr__,XmlNode *this,char *attributeName)

{
  bool bVar1;
  char *__s;
  allocator<char> local_39;
  string local_38 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = hasAttribute(this,attributeName);
  if (bVar1) {
    __s = (char *)xmlGetProp(this->mPimpl->mXmlNodePtr,attributeName);
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_38);
    std::__cxx11::string::~string(local_38);
    (*_xmlFree)(__s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlNode::attribute(const char *attributeName) const
{
    std::string attributeValueString;
    if (hasAttribute(attributeName)) {
        xmlChar *attributeValue = xmlGetProp(mPimpl->mXmlNodePtr, reinterpret_cast<const xmlChar *>(attributeName));
        attributeValueString = std::string(reinterpret_cast<const char *>(attributeValue));
        xmlFree(attributeValue);
    }
    return attributeValueString;
}